

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O2

bool __thiscall
ctemplate::SectionTemplateNode::AddTextNode
          (SectionTemplateNode *this,TemplateToken *token,Template *my_template)

{
  HtmlParser *this_00;
  char *pcVar1;
  int iVar2;
  TextTemplateNode *this_01;
  ostream *poVar3;
  bool bVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string error_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (token == (TemplateToken *)0x0) {
    __assert_fail("token",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template.cc"
                  ,0x603,
                  "bool ctemplate::SectionTemplateNode::AddTextNode(const TemplateToken *, Template *)"
                 );
  }
  bVar4 = true;
  if (token->textlen != 0) {
    this_00 = my_template->htmlparser_;
    this_01 = (TextTemplateNode *)operator_new(0x38);
    TextTemplateNode::TextTemplateNode(this_01,token);
    error_msg._M_dataplus._M_p = (pointer)this_01;
    std::__cxx11::list<ctemplate::TemplateNode_*,_std::allocator<ctemplate::TemplateNode_*>_>::
    push_back(&this->node_list_,(value_type *)&error_msg);
    if (my_template->initial_context_ - TC_HTML < 3) {
      if (this_00 == (HtmlParser *)0x0) {
        __assert_fail("htmlparser",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template.cc"
                      ,0x60a,
                      "bool ctemplate::SectionTemplateNode::AddTextNode(const TemplateToken *, Template *)"
                     );
      }
      iVar2 = ctemplate_htmlparser::HtmlParser::state(this_00);
      if ((iVar2 != 7) &&
         (iVar2 = ctemplate_htmlparser::HtmlParser::Parse(this_00,token->text,(int)token->textlen),
         iVar2 != 7)) {
        return true;
      }
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,token->text,token->text + token->textlen);
      std::operator+(&local_70,"Failed parsing: ",&local_b0);
      std::operator+(&local_50,&local_70,"\nIn: ");
      pcVar1 = (this->token_).text;
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d0,pcVar1,pcVar1 + (this->token_).textlen);
      std::operator+(&error_msg,&local_50,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_b0);
      poVar3 = std::operator<<((ostream *)&std::cerr,"ERROR: ");
      poVar3 = std::operator<<(poVar3,"Template ");
      poVar3 = std::operator<<(poVar3,(my_template->resolved_filename_)._M_dataplus._M_p);
      std::operator<<(poVar3,": ");
      poVar3 = std::operator<<((ostream *)&std::cerr,"ERROR: ");
      poVar3 = std::operator<<(poVar3,"Auto-Escape: ");
      poVar3 = std::operator<<(poVar3,(string *)&error_msg);
      std::endl<char,std::char_traits<char>>(poVar3);
      std::__cxx11::string::~string((string *)&error_msg);
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

bool SectionTemplateNode::AddTextNode(const TemplateToken* token,
                                      Template* my_template) {
  assert(token);
  bool success = true;
  HtmlParser *htmlparser = my_template->htmlparser_;

  if (token->textlen > 0) {  // ignore null text sections
    node_list_.push_back(new TextTemplateNode(*token));
    if (AUTO_ESCAPE_PARSING_CONTEXT(my_template->initial_context_)) {
      assert(htmlparser);
      if (htmlparser->state() == HtmlParser::STATE_ERROR ||
          htmlparser->Parse(token->text, static_cast<int>(token->textlen)) ==
          HtmlParser::STATE_ERROR) {
        string error_msg =  "Failed parsing: " +
            string(token->text, token->textlen) +
            "\nIn: " + string(token_.text, token_.textlen);
        LOG_AUTO_ESCAPE_ERROR(error_msg, my_template);
        success = false;
      }
    }
  }
  return success;
}